

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  __pid_t _Var3;
  TestRole TVar4;
  size_t sVar5;
  int *piVar6;
  long *plVar7;
  long *plVar8;
  size_type *psVar9;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  long lVar11;
  char *pcVar12;
  ostream *poVar13;
  int pipe_fd [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_140;
  long local_138;
  long local_130;
  long lStack_128;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  int local_80;
  int local_7c;
  string local_78;
  int local_54;
  string local_50;
  
  sVar5 = GetThreadCount();
  if (sVar5 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_e0,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/extern/blt/thirdparty_builtin/googletest/googletest/src/gtest-death-test.cc"
                       ,0x449);
    Message::Message((Message *)&local_140);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_140._M_head_impl + 0x10),
               "Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_140._M_head_impl + 0x10)," in a threaded context. For this test, ",
               0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_140._M_head_impl + 0x10),"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_140._M_head_impl + 0x10)," ",1);
    poVar13 = (ostream *)(local_140._M_head_impl + 0x10);
    if (sVar5 == 0) {
      lVar11 = 0x26;
      pcVar12 = "couldn\'t detect the number of threads.";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_140._M_head_impl + 0x10));
      poVar13 = (ostream *)(local_140._M_head_impl + 0x10);
      lVar11 = 9;
      pcVar12 = " threads.";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar12,lVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_140._M_head_impl + 0x10),
               " See https://github.com/google/googletest/blob/main/docs/advanced.md#death-tests-and-threads"
               ,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_140._M_head_impl + 0x10),
               " for more explanation and suggested solutions, especially if",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_140._M_head_impl + 0x10),
               " this is the last message you see before your test times out.",0x3d);
    StringStreamToString(&local_120,local_140._M_head_impl);
    if (local_140._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_140._M_head_impl + 8))();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_120._M_dataplus._M_p,local_120._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_e0);
  }
  iVar2 = pipe(&local_80);
  if (iVar2 != -1) {
    paVar1 = &local_120.field_2;
    local_120._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var3 = fork();
    if (_Var3 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var3;
      if (_Var3 == 0) {
        while( true ) {
          iVar2 = close(local_80);
          if (iVar2 != -1) break;
          piVar6 = __errno_location();
          if (*piVar6 != 4) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"CHECK failed: File ","");
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_78);
            local_c0 = (long *)*plVar7;
            plVar8 = plVar7 + 2;
            if (local_c0 == plVar8) {
              local_b0 = *plVar8;
              lStack_a8 = plVar7[3];
              local_c0 = &local_b0;
            }
            else {
              local_b0 = *plVar8;
            }
            local_b8 = plVar7[1];
            *plVar7 = (long)plVar8;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_c0);
            local_100._M_dataplus._M_p = (pointer)*plVar7;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((size_type *)local_100._M_dataplus._M_p == psVar9) {
              local_100.field_2._M_allocated_capacity = *psVar9;
              local_100.field_2._8_8_ = plVar7[3];
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            }
            else {
              local_100.field_2._M_allocated_capacity = *psVar9;
            }
            local_100._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            local_54 = 0x45e;
            StreamableToString<int>(&local_50,&local_54);
            std::operator+(&local_a0,&local_100,&local_50);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
            local_e0._M_dataplus._M_p = (pointer)*plVar7;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((size_type *)local_e0._M_dataplus._M_p == psVar9) {
              local_e0.field_2._M_allocated_capacity = *psVar9;
              local_e0.field_2._8_8_ = plVar7[3];
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            }
            else {
              local_e0.field_2._M_allocated_capacity = *psVar9;
            }
            local_e0._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
            local_140._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7;
            pbVar10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (plVar7 + 2);
            if (local_140._M_head_impl == pbVar10) {
              local_130 = *(long *)pbVar10;
              lStack_128 = plVar7[3];
              local_140._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_130;
            }
            else {
              local_130 = *(long *)pbVar10;
            }
            local_138 = plVar7[1];
            *plVar7 = (long)pbVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
            local_120._M_dataplus._M_p = (pointer)*plVar7;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((size_type *)local_120._M_dataplus._M_p == psVar9) {
              local_120.field_2._M_allocated_capacity = *psVar9;
              local_120.field_2._8_8_ = plVar7[3];
              local_120._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_120.field_2._M_allocated_capacity = *psVar9;
            }
            local_120._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            DeathTestAbort(&local_120);
          }
        }
        (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_7c;
        UnitTest::GetInstance();
        (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
             false;
        g_in_fast_death_test_child = 1;
        TVar4 = EXECUTE_TEST;
      }
      else {
        while( true ) {
          iVar2 = close(local_7c);
          if (iVar2 != -1) break;
          piVar6 = __errno_location();
          if (*piVar6 != 4) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"CHECK failed: File ","");
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_78);
            local_c0 = (long *)*plVar7;
            plVar8 = plVar7 + 2;
            if (local_c0 == plVar8) {
              local_b0 = *plVar8;
              lStack_a8 = plVar7[3];
              local_c0 = &local_b0;
            }
            else {
              local_b0 = *plVar8;
            }
            local_b8 = plVar7[1];
            *plVar7 = (long)plVar8;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_c0);
            local_100._M_dataplus._M_p = (pointer)*plVar7;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((size_type *)local_100._M_dataplus._M_p == psVar9) {
              local_100.field_2._M_allocated_capacity = *psVar9;
              local_100.field_2._8_8_ = plVar7[3];
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            }
            else {
              local_100.field_2._M_allocated_capacity = *psVar9;
            }
            local_100._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            local_54 = 0x46a;
            StreamableToString<int>(&local_50,&local_54);
            std::operator+(&local_a0,&local_100,&local_50);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
            local_e0._M_dataplus._M_p = (pointer)*plVar7;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((size_type *)local_e0._M_dataplus._M_p == psVar9) {
              local_e0.field_2._M_allocated_capacity = *psVar9;
              local_e0.field_2._8_8_ = plVar7[3];
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            }
            else {
              local_e0.field_2._M_allocated_capacity = *psVar9;
            }
            local_e0._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
            local_140._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7;
            pbVar10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (plVar7 + 2);
            if (local_140._M_head_impl == pbVar10) {
              local_130 = *(long *)pbVar10;
              lStack_128 = plVar7[3];
              local_140._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_130;
            }
            else {
              local_130 = *(long *)pbVar10;
            }
            local_138 = plVar7[1];
            *plVar7 = (long)pbVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
            local_120._M_dataplus._M_p = (pointer)*plVar7;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((size_type *)local_120._M_dataplus._M_p == psVar9) {
              local_120.field_2._M_allocated_capacity = *psVar9;
              local_120.field_2._8_8_ = plVar7[3];
              local_120._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_120.field_2._M_allocated_capacity = *psVar9;
            }
            local_120._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            DeathTestAbort(&local_120);
          }
        }
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_80;
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        TVar4 = OVERSEE_TEST;
      }
      return TVar4;
    }
    local_c0 = &local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"CHECK failed: File ","");
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_c0);
    local_100._M_dataplus._M_p = (pointer)*plVar7;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_100._M_dataplus._M_p == psVar9) {
      local_100.field_2._M_allocated_capacity = *psVar9;
      local_100.field_2._8_8_ = plVar7[3];
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar9;
    }
    local_100._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
    local_a0._M_dataplus._M_p = (pointer)*plVar7;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_a0._M_dataplus._M_p == psVar9) {
      local_a0.field_2._M_allocated_capacity = *psVar9;
      local_a0.field_2._8_8_ = plVar7[3];
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar9;
    }
    local_a0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_50._M_dataplus._M_p._0_4_ = 0x45b;
    StreamableToString<int>(&local_78,(int *)&local_50);
    std::operator+(&local_e0,&local_a0,&local_78);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
    local_140._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7;
    pbVar10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (plVar7 + 2);
    if (local_140._M_head_impl == pbVar10) {
      local_130 = *(long *)pbVar10;
      lStack_128 = plVar7[3];
      local_140._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130;
    }
    else {
      local_130 = *(long *)pbVar10;
    }
    local_138 = plVar7[1];
    *plVar7 = (long)pbVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
    local_120._M_dataplus._M_p = (pointer)*plVar7;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_120._M_dataplus._M_p == psVar9) {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120.field_2._8_8_ = plVar7[3];
      local_120._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar9;
    }
    local_120._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    DeathTestAbort(&local_120);
  }
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"CHECK failed: File ","");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_100._M_dataplus._M_p = (pointer)*plVar7;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_100._M_dataplus._M_p == psVar9) {
    local_100.field_2._M_allocated_capacity = *psVar9;
    local_100.field_2._8_8_ = plVar7[3];
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar9;
  }
  local_100._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_a0._M_dataplus._M_p = (pointer)*plVar7;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_a0._M_dataplus._M_p == psVar9) {
    local_a0.field_2._M_allocated_capacity = *psVar9;
    local_a0.field_2._8_8_ = plVar7[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar9;
  }
  local_a0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_50._M_dataplus._M_p._0_4_ = 0x44d;
  StreamableToString<int>(&local_78,(int *)&local_50);
  std::operator+(&local_e0,&local_a0,&local_78);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_140._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7;
  pbVar10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar7 + 2);
  if (local_140._M_head_impl == pbVar10) {
    local_130 = *(long *)pbVar10;
    lStack_128 = plVar7[3];
    local_140._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130;
  }
  else {
    local_130 = *(long *)pbVar10;
  }
  local_138 = plVar7[1];
  *plVar7 = (long)pbVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
  local_120._M_dataplus._M_p = (pointer)*plVar7;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_120._M_dataplus._M_p == psVar9) {
    local_120.field_2._M_allocated_capacity = *psVar9;
    local_120.field_2._8_8_ = plVar7[3];
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar9;
  }
  local_120._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  DeathTestAbort(&local_120);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}